

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O1

int ldecode(lua_State *L)

{
  int iVar1;
  uint uVar2;
  sproto_type *st;
  void *data;
  size_t sz;
  decode_ud self;
  size_t local_60;
  lua_State *local_58;
  undefined8 local_50;
  undefined4 local_48;
  int local_44;
  undefined8 local_40;
  undefined4 local_38;
  
  st = (sproto_type *)lua_touserdata(L,1);
  if (st != (sproto_type *)0x0) {
    local_60 = 0;
    data = getbuffer(L,2,&local_60);
    iVar1 = lua_type(L,-1);
    if (iVar1 != 5) {
      lua_createtable(L,0,0);
    }
    luaL_checkstack(L,200,(char *)0x0);
    local_58 = L;
    local_44 = lua_gettop(L);
    local_48 = 0;
    local_50 = 0;
    local_40 = 0xffffffff00000000;
    local_38 = 0;
    uVar2 = sproto_decode(st,data,(int)local_60,decode,&local_58);
    if ((int)uVar2 < 0) {
      iVar1 = luaL_error(L,"decode error");
    }
    else {
      lua_settop(L,local_44);
      lua_pushinteger(L,(ulong)uVar2);
      iVar1 = 2;
    }
    return iVar1;
  }
  iVar1 = luaL_argerror(L,1,"Need a sproto_type object");
  return iVar1;
}

Assistant:

static int
ldecode(lua_State *L) {
	const int32_t * data = lua_touserdata(L,1);
	if (data == NULL) {
		return 0;
	}
	const uint8_t * b = (const uint8_t *)data;
	int32_t len = get_length(b);
	struct bson_reader br = { b , len };

	unpack_dict(L, &br, false);

	return 1;
}